

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  _func_void_FieldDescriptor_ptr *__s;
  undefined1 *field_00;
  undefined1 local_d8 [32];
  undefined1 local_b8;
  undefined1 local_b6;
  undefined7 local_b5;
  undefined4 uStack_ae;
  undefined1 *local_a8;
  undefined1 local_98 [24];
  undefined1 *local_80;
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined1 local_50 [16];
  undefined8 local_40;
  cpp *local_38;
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_d8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_38 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_d8,
               (FieldDescriptor **)&local_38);
  }
  field_00 = FieldDescriptor::kTypeToCppTypeMap;
  __s = (_func_void_FieldDescriptor_ptr *)(local_d8 + 0x10);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) == 4) {
    local_d8._0_8_ = __s;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"GG","");
    UInt64ToString(__return_storage_ptr__,(string *)local_d8,*(uint64 *)(this + 0x90));
  }
  else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) == 2) {
    local_d8._0_8_ = __s;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"GG","");
    Int64ToString(__return_storage_ptr__,(string *)local_d8,*(int64 *)(this + 0x90));
  }
  else {
    memset(__s,0,0x88);
    local_d8._8_8_ = 0;
    local_b8 = 0;
    local_b6 = 1;
    local_b5 = 0;
    uStack_ae = 0;
    local_98[0] = 0;
    local_80 = local_70;
    local_70[0] = 0;
    local_50[0] = 0;
    local_40 = 0;
    local_d8._0_8_ = __s;
    local_a8 = local_98;
    local_60 = local_50;
    DefaultValue_abi_cxx11_
              (__return_storage_ptr__,(cpp *)local_d8,(Options *)this,(FieldDescriptor *)field_00);
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
  }
  if ((_func_void_FieldDescriptor_ptr *)local_d8._0_8_ != __s) {
    operator_delete((void *)local_d8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("GG", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("GG", field->default_value_uint64());
    default:
      return DefaultValue(Options(), field);
  }
}